

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluent_builder.cpp
# Opt level: O1

string * __thiscall
HtmlElement::str_abi_cxx11_(string *__return_storage_ptr__,HtmlElement *this,int indent_size)

{
  pointer pHVar1;
  ostream *poVar2;
  pointer this_00;
  string indent_str;
  ostringstream out;
  string local_1f0;
  string *local_1d0;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct((ulong)&local_1c8,(char)indent_size);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->tag_name)._M_dataplus._M_p,(this->tag_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,">",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((this->contents)._M_string_length != 0) {
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_1f0,(char)indent_size * '\x02');
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(this->contents)._M_dataplus._M_p,(this->contents)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = (this->children).super__Vector_base<HtmlElement,_std::allocator<HtmlElement>_>._M_impl.
            super__Vector_impl_data._M_start;
  pHVar1 = (this->children).super__Vector_base<HtmlElement,_std::allocator<HtmlElement>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 != pHVar1) {
    do {
      str_abi_cxx11_(&local_1f0,this_00,2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pHVar1);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->tag_name)._M_dataplus._M_p,(this->tag_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,">",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return local_1d0;
}

Assistant:

std::string str(int indent_size = 0) const
	{
		std::ostringstream out;
		std::string indent_str(indent_size * base_indent, ' ');
		out << indent_str << "<" << tag_name << ">" << std::endl;;

		if(!contents.empty())
		{
			out << std::string(indent_size * (base_indent + 1), ' ') << contents << std::endl;;
		}

		for(const auto& e : children)
		{
			out << e.str(base_indent + 1);
		}

		out << indent_str << "</" << tag_name << ">" << std::endl;;
		return out.str();
	}